

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::StringToDoubleMap::~StringToDoubleMap(StringToDoubleMap *this)

{
  Arena *pAVar1;
  StringToDoubleMap *this_local;
  
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (pAVar1 == (Arena *)0x0) {
    SharedDtor(this);
    google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_);
  }
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::StringToDoubleMap_MapEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1>
  ::~MapFieldLite(&this->map_);
  google::protobuf::MessageLite::~MessageLite(&this->super_MessageLite);
  return;
}

Assistant:

StringToDoubleMap::~StringToDoubleMap() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.StringToDoubleMap)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}